

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void __thiscall IR::IndirOpnd::SetIndexOpnd(IndirOpnd *this,RegOpnd *indexOpnd)

{
  Opnd *this_00;
  RegOpnd *pRVar1;
  
  if (this->m_indexOpnd != (RegOpnd *)0x0) {
    Opnd::UnUse(&this->m_indexOpnd->super_Opnd);
  }
  if (indexOpnd == (RegOpnd *)0x0) {
    pRVar1 = (RegOpnd *)0x0;
  }
  else {
    this_00 = Opnd::Use(&indexOpnd->super_Opnd,this->m_func);
    pRVar1 = Opnd::AsRegOpnd(this_00);
  }
  this->m_indexOpnd = pRVar1;
  return;
}

Assistant:

void
IndirOpnd::SetIndexOpnd(RegOpnd *indexOpnd)
{
    if (m_indexOpnd)
    {
        m_indexOpnd->UnUse();
    }
    if (indexOpnd)
    {
        indexOpnd = indexOpnd->Use(m_func)->AsRegOpnd();
    }

    m_indexOpnd = indexOpnd;
}